

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::draw_outside_label(Fl_Group *this,Fl_Widget *widget)

{
  uint uVar1;
  Fl_Align FVar2;
  int iVar3;
  undefined4 extraout_var;
  int local_34;
  int local_30;
  int wy;
  int wx;
  int H;
  int W;
  int Y;
  int X;
  Fl_Align a;
  Fl_Widget *widget_local;
  Fl_Group *this_local;
  
  uVar1 = Fl_Widget::visible(widget);
  if (((uVar1 != 0) && (FVar2 = Fl_Widget::align(widget), (FVar2 & 0xf) != 0)) &&
     (FVar2 = Fl_Widget::align(widget), (FVar2 & 0x10) == 0)) {
    Y = Fl_Widget::align(widget);
    W = Fl_Widget::x(widget);
    H = Fl_Widget::y(widget);
    wx = Fl_Widget::w(widget);
    wy = Fl_Widget::h(widget);
    iVar3 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[8])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      local_30 = Fl_Widget::x(&this->super_Fl_Widget);
      local_34 = Fl_Widget::y(&this->super_Fl_Widget);
    }
    else {
      local_34 = 0;
      local_30 = 0;
    }
    if ((Y & 0xfU) == 7) {
      Y = Y & 0xfffffff0U | 9;
      W = local_30;
      iVar3 = Fl_Widget::x(widget);
      wx = (iVar3 - local_30) + -3;
    }
    else if ((Y & 0xfU) == 0xd) {
      Y = Y & 0xfffffff0U | 10;
      W = local_30;
      iVar3 = Fl_Widget::x(widget);
      wx = (iVar3 - local_30) + -3;
    }
    else if ((Y & 0xfU) == 0xb) {
      Y = Y & 0xfffffff0U | 5;
      W = W + wx + 3;
      iVar3 = Fl_Widget::w(&this->super_Fl_Widget);
      wx = (local_30 + iVar3) - W;
    }
    else if ((Y & 0xfU) == 0xe) {
      Y = Y & 0xfffffff0U | 6;
      W = W + wx + 3;
      iVar3 = Fl_Widget::w(&this->super_Fl_Widget);
      wx = (local_30 + iVar3) - W;
    }
    else if ((Y & 1U) == 0) {
      if ((Y & 2U) == 0) {
        if ((Y & 4U) == 0) {
          if ((Y & 8U) != 0) {
            Y = Y ^ 0xc;
            W = W + wx + 3;
            iVar3 = Fl_Widget::w(&this->super_Fl_Widget);
            wx = (local_30 + iVar3) - W;
          }
        }
        else {
          Y = Y ^ 0xc;
          W = local_30;
          iVar3 = Fl_Widget::x(widget);
          wx = (iVar3 - local_30) + -3;
        }
      }
      else {
        Y = Y ^ 3;
        H = H + wy;
        iVar3 = Fl_Widget::h(&this->super_Fl_Widget);
        wy = (local_34 + iVar3) - H;
      }
    }
    else {
      Y = Y ^ 3;
      H = local_34;
      iVar3 = Fl_Widget::y(widget);
      wy = iVar3 - local_34;
    }
    Fl_Widget::draw_label(widget,W,H,wx,wy,Y);
  }
  return;
}

Assistant:

void Fl_Group::draw_outside_label(const Fl_Widget& widget) const {
  if (!widget.visible()) return;
  // skip any labels that are inside the widget:
  if (!(widget.align()&15) || (widget.align() & FL_ALIGN_INSIDE)) return;
  // invent a box that is outside the widget:
  Fl_Align a = widget.align();
  int X = widget.x();
  int Y = widget.y();
  int W = widget.w();
  int H = widget.h();
  int wx, wy;
  if (const_cast<Fl_Group*>(this)->as_window()) {
    wx = wy = 0;
  } else {
    wx = x(); wy = y();
  }
  if ( (a & 0x0f) == FL_ALIGN_LEFT_TOP ) {
    a = (a &~0x0f ) | FL_ALIGN_TOP_RIGHT;
    X = wx;
    W = widget.x()-X-3;
  } else if ( (a & 0x0f) == FL_ALIGN_LEFT_BOTTOM ) {
    a = (a &~0x0f ) | FL_ALIGN_BOTTOM_RIGHT; 
    X = wx;
    W = widget.x()-X-3;
  } else if ( (a & 0x0f) == FL_ALIGN_RIGHT_TOP ) {
    a = (a &~0x0f ) | FL_ALIGN_TOP_LEFT; 
    X = X+W+3;
    W = wx+this->w()-X;
  } else if ( (a & 0x0f) == FL_ALIGN_RIGHT_BOTTOM ) {
    a = (a &~0x0f ) | FL_ALIGN_BOTTOM_LEFT; 
    X = X+W+3;
    W = wx+this->w()-X;
  } else if (a & FL_ALIGN_TOP) {
    a ^= (FL_ALIGN_BOTTOM|FL_ALIGN_TOP);
    Y = wy;
    H = widget.y()-Y;
  } else if (a & FL_ALIGN_BOTTOM) {
    a ^= (FL_ALIGN_BOTTOM|FL_ALIGN_TOP);
    Y = Y+H;
    H = wy+h()-Y;
  } else if (a & FL_ALIGN_LEFT) {
    a ^= (FL_ALIGN_LEFT|FL_ALIGN_RIGHT);
    X = wx;
    W = widget.x()-X-3;
  } else if (a & FL_ALIGN_RIGHT) {
    a ^= (FL_ALIGN_LEFT|FL_ALIGN_RIGHT);
    X = X+W+3;
    W = wx+this->w()-X;
  }
  widget.draw_label(X,Y,W,H,(Fl_Align)a);
}